

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall String::replace(String *this,String *needle,String *replacement)

{
  usize uVar1;
  char *pcVar2;
  char *__needle;
  char *__haystack;
  String result;
  String local_58;
  
  __haystack = this->data->str;
  pcVar2 = operator_cast_to_char_(needle);
  pcVar2 = strstr(__haystack,pcVar2);
  if (pcVar2 != (char *)0x0) {
    String(&local_58,replacement->data->len * 10 + this->data->len);
    do {
      append(&local_58,__haystack,(long)pcVar2 - (long)__haystack);
      append(&local_58,replacement);
      uVar1 = needle->data->len;
      __needle = operator_cast_to_char_(needle);
      __haystack = pcVar2 + uVar1;
      pcVar2 = strstr(__haystack,__needle);
    } while (pcVar2 != (char *)0x0);
    append(&local_58,__haystack,(usize)(this->data->str + (this->data->len - (long)__haystack)));
    this = operator=(this,&local_58);
    ~String(&local_58);
  }
  return this;
}

Assistant:

String& String::replace(const String& needle, const String& replacement)
{
  const char* p = data->str;
  const char* match = strstr(p, needle);
  if(!match)
    return *this;
  String result(data->len + replacement.data->len * 10);
  for(;;)
  {
    result.append(p, match - p);
    result.append(replacement);
    p = match + needle.data->len;
    match = strstr(p, needle);
    if(!match)
    {
      result.append(p, data->len - (p - data->str));
      return *this = result;
    }
  }
}